

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  TypedTestSuitePState *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  const_iterator cVar11;
  const_iterator cVar12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  undefined8 extraout_RAX;
  TypedTestSuitePState *pTVar15;
  size_t sVar16;
  long lVar17;
  char *pcVar18;
  ostream *poVar19;
  TypedTestSuitePState *pTVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer __k;
  Message errors;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  string local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  TypedTestSuitePState *local_f8;
  uint local_ec;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  _Base_ptr local_c8;
  size_t local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  char *local_98;
  internal *local_90;
  _Base_ptr local_88;
  TypedTestSuitePState *local_80;
  CodeLocation local_78;
  string local_50;
  
  pTVar15 = (TypedTestSuitePState *)(ulong)(uint)line;
  local_f8 = this;
  local_98 = registered_tests;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,file,(allocator<char> *)&local_120);
  paVar2 = &local_78.file.field_2;
  local_78.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_e8,(TypedTestSuitePState *)(local_e0._0_8_ + (long)local_e8))
  ;
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e0 + 8);
  local_ec = line;
  local_90 = (internal *)file;
  if (local_e8 != (undefined1  [8])paVar2) {
    operator_delete((void *)local_e8,local_e0._8_8_ + 1);
  }
  *local_f8 = (TypedTestSuitePState)0x1;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar18 = local_98 + -1;
  do {
    pbVar3 = (byte *)(pcVar18 + 1);
    pcVar18 = pcVar18 + 1;
    iVar7 = isspace((uint)*pbVar3);
  } while (iVar7 != 0);
  paVar4 = &local_120.field_2;
  do {
    pcVar9 = strchr(pcVar18,0x2c);
    local_120._M_dataplus._M_p = (pointer)paVar4;
    if (pcVar9 == (char *)0x0) {
      sVar16 = strlen(pcVar18);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,pcVar18,pcVar18 + sVar16)
      ;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,pcVar18,pcVar9);
    }
    _Var10._M_p = local_120._M_dataplus._M_p;
    if ((TypedTestSuitePState *)local_120._M_string_length != (TypedTestSuitePState *)0x0) {
      pTVar20 = (TypedTestSuitePState *)
                (local_120._M_string_length + (long)local_120._M_dataplus._M_p);
      do {
        _Var5._M_p = local_120._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pTVar20[-1]);
        _Var10._M_p = _Var5._M_p;
        if (iVar7 == 0) break;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pTVar20 + -1);
        lVar17 = (long)paVar21 - (long)_Var5._M_p;
        if (((TypedTestSuitePState *)local_120._M_string_length !=
             (TypedTestSuitePState *)(lVar17 + 1)) &&
           (sVar16 = local_120._M_string_length - (lVar17 + 1), sVar16 != 0)) {
          pcVar9 = local_120._M_dataplus._M_p + lVar17;
          if (sVar16 == 1) {
            *pcVar9 = pcVar9[1];
          }
          else {
            memmove(pcVar9,local_120._M_dataplus._M_p + lVar17 + 1,sVar16);
          }
        }
        pTVar1 = (TypedTestSuitePState *)(local_120._M_string_length + -1);
        (local_120._M_dataplus._M_p + -1)[local_120._M_string_length] = '\0';
        pTVar20 = (TypedTestSuitePState *)(local_120._M_dataplus._M_p + lVar17);
        _Var10._M_p = local_120._M_dataplus._M_p;
        pTVar15 = (TypedTestSuitePState *)local_120._M_string_length;
        local_120._M_string_length = (size_type)pTVar1;
      } while (paVar21 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var5._M_p);
    }
    local_e8 = (undefined1  [8])_Var10._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == paVar4) {
      local_e0._16_8_ = local_120.field_2._8_8_;
      local_e8 = (undefined1  [8])paVar2;
    }
    local_e0._9_7_ = local_120.field_2._M_allocated_capacity._1_7_;
    local_e0[8] = local_120.field_2._M_local_buf[0];
    local_e0._0_8_ = local_120._M_string_length;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar4;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    if (local_e8 != (undefined1  [8])paVar2) {
      operator_delete((void *)local_e8,local_e0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar4) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    pcVar18 = strchr(pcVar18,0x2c);
    if (pcVar18 == (char *)0x0) {
      pcVar18 = (char *)0x0;
    }
    else {
      do {
        pbVar3 = (byte *)(pcVar18 + 1);
        pcVar18 = pcVar18 + 1;
        iVar7 = isspace((uint)*pbVar3);
      } while (iVar7 != 0);
    }
  } while (pcVar18 != (char *)0x0);
  Message::Message((Message *)&local_100);
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  local_e0._8_8_ = 0;
  local_c0 = 0;
  local_e0._16_8_ = (_Base_ptr)local_e0;
  local_c8 = (_Base_ptr)local_e0;
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar19 = (ostream *)(local_100._M_head_impl + 0x10);
    pTVar15 = local_f8 + 8;
    local_88 = (_Base_ptr)(local_f8 + 0x10);
    __k = local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_80 = pTVar15;
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,__k);
      if (cVar11._M_node == (_Base_ptr)local_e0) {
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                         *)local_80,__k);
        if (cVar12._M_node == local_88) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"No test named ",0xe);
          lVar17 = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          pcVar18 = " can be found in this test suite.\n";
          goto LAB_00123c74;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_e8,__k);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Test ",5);
        lVar17 = 0x1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        pcVar18 = " is listed more than once.\n";
LAB_00123c74:
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar18,lVar17);
      }
      __k = __k + 1;
    } while (__k != local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar7 = (int)pTVar15;
  p_Var14 = *(_Rb_tree_node_base **)(local_f8 + 0x20);
  p_Var13 = (_Rb_tree_node_base *)(local_f8 + 0x10);
  if (p_Var14 != p_Var13) {
    do {
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,(key_type *)(p_Var14 + 1));
      if (cVar11._M_node == (_Base_ptr)local_e0) {
        poVar19 = (ostream *)(local_100._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,".\n",2);
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      iVar7 = (int)pTVar15;
    } while (p_Var14 != p_Var13);
  }
  _Var6._M_head_impl = local_100._M_head_impl;
  StringStreamToString(&local_120,local_100._M_head_impl);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_120,"");
  if (iVar8 != 0) {
    FormatFileLocation_abi_cxx11_(&local_50,local_90,(char *)(ulong)local_ec,iVar7);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar4) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
    if (local_100._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar4) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  if (_Var6._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return local_98;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end(); ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}